

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LToken.cpp
# Opt level: O0

string * __thiscall LToken::str_abi_cxx11_(string *__return_storage_ptr__,LToken *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  LToken *local_18;
  LToken *this_local;
  
  local_18 = this;
  this_local = (LToken *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  switch(this->type) {
  case ADD:
    std::operator<<(local_190,"ADD");
    break;
  case BR:
    std::operator<<(local_190,"BR");
    break;
  case BRAC:
    std::operator<<(local_190,"BRAC");
    break;
  default:
    std::operator<<(local_190,"INVALID");
    break;
  case ELSE:
    std::operator<<(local_190,"ELSE");
    break;
  case END:
    std::operator<<(local_190,"END");
    break;
  case EOFF:
    std::operator<<(local_190,"EOFF");
    break;
  case EQ:
    std::operator<<(local_190,"EQ");
    break;
  case EQUAL:
    std::operator<<(local_190,"EQUAL");
    break;
  case FUNCTION:
    std::operator<<(local_190,"FUNCTION");
    break;
  case G:
    std::operator<<(local_190,"G");
    break;
  case GEQ:
    std::operator<<(local_190,"GEQ");
    break;
  case IF:
    std::operator<<(local_190,"IF");
    break;
  case INT:
    poVar1 = std::operator<<(local_190,"INT: ");
    std::operator<<(poVar1,(string *)&this->token);
    break;
  case KET:
    std::operator<<(local_190,"KET");
    break;
  case L:
    std::operator<<(local_190,"L");
    break;
  case LEQ:
    std::operator<<(local_190,"LEQ");
    break;
  case NEQ:
    std::operator<<(local_190,"NEQ");
    break;
  case SUB:
    std::operator<<(local_190,"SUB");
    break;
  case THEN:
    std::operator<<(local_190,"THEN");
    break;
  case VAR:
    poVar1 = std::operator<<(local_190,"VAR: ");
    std::operator<<(poVar1,(string *)&this->token);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string LToken::str() {
    std::stringstream ss;
    switch (this->type) {
        case LNodeType::INT:
            ss << "INT: " << this->token;
            break;
        case LNodeType::VAR:
            ss << "VAR: " << this->token;
            break;
        case LNodeType::EQUAL:
            ss << "EQUAL";
            break;
        case LNodeType::L:
            ss << "L";
            break;
        case LNodeType::G:
            ss << "G";
            break;
        case LNodeType::BRAC:
            ss << "BRAC";
            break;
        case LNodeType::KET:
            ss << "KET";
            break;
        case LNodeType::BR:
            ss << "BR";
            break;
        case LNodeType::ADD:
            ss << "ADD";
            break;
        case LNodeType::SUB:
            ss << "SUB";
            break;
        case LNodeType::EQ:
            ss << "EQ";
            break;
        case LNodeType::NEQ:
            ss << "NEQ";
            break;
        case LNodeType::LEQ:
            ss << "LEQ";
            break;
        case LNodeType::GEQ:
            ss << "GEQ";
            break;
        case LNodeType::FUNCTION:
            ss << "FUNCTION";
            break;
        case LNodeType::IF:
            ss << "IF";
            break;
        case LNodeType::THEN:
            ss << "THEN";
            break;
        case LNodeType::ELSE:
            ss << "ELSE";
            break;
        case LNodeType::END:
            ss << "END";
            break;
        case LNodeType::EOFF:
            ss << "EOFF";
            break;
        default:
            ss << "INVALID";
            break;
    }
    return ss.str();
}